

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_rff.cpp
# Opt level: O3

bool __thiscall FRFFFile::Open(FRFFFile *this,bool quiet)

{
  byte *pbVar1;
  byte *pbVar2;
  BYTE *pBVar3;
  FileReader *pFVar4;
  FRFFLump *pFVar5;
  char cVar6;
  char cVar14;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  byte bVar50;
  undefined1 auVar51 [16];
  void *pvVar52;
  ulong *puVar53;
  size_t sVar54;
  ulong uVar55;
  long lVar56;
  char *__src;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  short sVar73;
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  short sVar82;
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  char name [13];
  char local_6d [8];
  undefined1 local_65;
  FRFFFile *local_60;
  void *local_58;
  FString local_50;
  undefined1 local_48 [8];
  uint local_40;
  uint local_3c;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  undefined4 uVar74;
  undefined6 uVar75;
  undefined8 uVar76;
  undefined1 auVar77 [12];
  undefined1 auVar78 [14];
  undefined1 auVar80 [16];
  undefined4 uVar83;
  undefined6 uVar84;
  undefined8 uVar85;
  undefined1 auVar86 [12];
  undefined1 auVar87 [14];
  undefined1 auVar89 [16];
  
  pFVar4 = (this->super_FResourceFile).Reader;
  (*(pFVar4->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar4,local_48,0x10);
  (this->super_FResourceFile).NumLumps = local_3c;
  pvVar52 = operator_new__((ulong)local_3c * 0x30);
  pFVar4 = (this->super_FResourceFile).Reader;
  (*(pFVar4->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar4,(ulong)local_40,0);
  pFVar4 = (this->super_FResourceFile).Reader;
  local_60 = this;
  (*(pFVar4->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar4,pvVar52,(ulong)local_3c * 0x30);
  auVar51 = _DAT_0073c400;
  if (0 < (int)(local_3c * 0x30)) {
    uVar57 = 0xc;
    uVar58 = 0xd;
    uVar59 = 0xe;
    uVar60 = 0xf;
    uVar61 = 8;
    uVar62 = 9;
    uVar63 = 10;
    uVar64 = 0xb;
    uVar65 = 4;
    uVar66 = 5;
    uVar67 = 6;
    uVar68 = 7;
    uVar69 = 0;
    uVar70 = 1;
    uVar71 = 2;
    uVar72 = 3;
    uVar55 = 0;
    do {
      auVar90._0_4_ = (uVar57 >> 1) + local_40;
      auVar90._4_4_ = (uVar58 >> 1) + local_40;
      auVar90._8_4_ = (uVar59 >> 1) + local_40;
      auVar90._12_4_ = (uVar60 >> 1) + local_40;
      auVar88._0_4_ = (uVar61 >> 1) + local_40;
      auVar88._4_4_ = (uVar62 >> 1) + local_40;
      auVar88._8_4_ = (uVar63 >> 1) + local_40;
      auVar88._12_4_ = (uVar64 >> 1) + local_40;
      auVar81._0_4_ = (uVar65 >> 1) + local_40;
      auVar81._4_4_ = (uVar66 >> 1) + local_40;
      auVar81._8_4_ = (uVar67 >> 1) + local_40;
      auVar81._12_4_ = (uVar68 >> 1) + local_40;
      auVar79._0_4_ = (uVar69 >> 1) + local_40;
      auVar79._4_4_ = (uVar70 >> 1) + local_40;
      auVar79._8_4_ = (uVar71 >> 1) + local_40;
      auVar79._12_4_ = (uVar72 >> 1) + local_40;
      pbVar1 = (byte *)((long)pvVar52 + uVar55);
      bVar36 = pbVar1[1];
      bVar37 = pbVar1[2];
      bVar38 = pbVar1[3];
      bVar39 = pbVar1[4];
      bVar40 = pbVar1[5];
      bVar41 = pbVar1[6];
      bVar42 = pbVar1[7];
      bVar43 = pbVar1[8];
      bVar44 = pbVar1[9];
      bVar45 = pbVar1[10];
      bVar46 = pbVar1[0xb];
      bVar47 = pbVar1[0xc];
      bVar48 = pbVar1[0xd];
      bVar49 = pbVar1[0xe];
      bVar50 = pbVar1[0xf];
      auVar79 = auVar79 & auVar51;
      auVar81 = auVar81 & auVar51;
      sVar22 = auVar79._0_2_;
      cVar6 = (0 < sVar22) * (sVar22 < 0x100) * auVar79[0] - (0xff < sVar22);
      sVar22 = auVar79._2_2_;
      sVar73 = CONCAT11((0 < sVar22) * (sVar22 < 0x100) * auVar79[2] - (0xff < sVar22),cVar6);
      sVar22 = auVar79._4_2_;
      cVar7 = (0 < sVar22) * (sVar22 < 0x100) * auVar79[4] - (0xff < sVar22);
      sVar22 = auVar79._6_2_;
      uVar74 = CONCAT13((0 < sVar22) * (sVar22 < 0x100) * auVar79[6] - (0xff < sVar22),
                        CONCAT12(cVar7,sVar73));
      sVar22 = auVar79._8_2_;
      cVar8 = (0 < sVar22) * (sVar22 < 0x100) * auVar79[8] - (0xff < sVar22);
      sVar22 = auVar79._10_2_;
      uVar75 = CONCAT15((0 < sVar22) * (sVar22 < 0x100) * auVar79[10] - (0xff < sVar22),
                        CONCAT14(cVar8,uVar74));
      sVar22 = auVar79._12_2_;
      cVar9 = (0 < sVar22) * (sVar22 < 0x100) * auVar79[0xc] - (0xff < sVar22);
      sVar22 = auVar79._14_2_;
      uVar76 = CONCAT17((0 < sVar22) * (sVar22 < 0x100) * auVar79[0xe] - (0xff < sVar22),
                        CONCAT16(cVar9,uVar75));
      sVar22 = auVar81._0_2_;
      cVar10 = (0 < sVar22) * (sVar22 < 0x100) * auVar81[0] - (0xff < sVar22);
      sVar22 = auVar81._2_2_;
      auVar77._0_10_ =
           CONCAT19((0 < sVar22) * (sVar22 < 0x100) * auVar81[2] - (0xff < sVar22),
                    CONCAT18(cVar10,uVar76));
      sVar22 = auVar81._4_2_;
      cVar11 = (0 < sVar22) * (sVar22 < 0x100) * auVar81[4] - (0xff < sVar22);
      auVar77[10] = cVar11;
      sVar22 = auVar81._6_2_;
      auVar77[0xb] = (0 < sVar22) * (sVar22 < 0x100) * auVar81[6] - (0xff < sVar22);
      sVar22 = auVar81._8_2_;
      cVar12 = (0 < sVar22) * (sVar22 < 0x100) * auVar81[8] - (0xff < sVar22);
      auVar78[0xc] = cVar12;
      auVar78._0_12_ = auVar77;
      sVar22 = auVar81._10_2_;
      auVar78[0xd] = (0 < sVar22) * (sVar22 < 0x100) * auVar81[10] - (0xff < sVar22);
      sVar22 = auVar81._12_2_;
      cVar13 = (0 < sVar22) * (sVar22 < 0x100) * auVar81[0xc] - (0xff < sVar22);
      auVar80[0xe] = cVar13;
      auVar80._0_14_ = auVar78;
      sVar22 = auVar81._14_2_;
      auVar80[0xf] = (0 < sVar22) * (sVar22 < 0x100) * auVar81[0xe] - (0xff < sVar22);
      auVar88 = auVar88 & auVar51;
      auVar90 = auVar90 & auVar51;
      sVar22 = auVar88._0_2_;
      cVar14 = (0 < sVar22) * (sVar22 < 0x100) * auVar88[0] - (0xff < sVar22);
      sVar22 = auVar88._2_2_;
      sVar82 = CONCAT11((0 < sVar22) * (sVar22 < 0x100) * auVar88[2] - (0xff < sVar22),cVar14);
      sVar22 = auVar88._4_2_;
      cVar15 = (0 < sVar22) * (sVar22 < 0x100) * auVar88[4] - (0xff < sVar22);
      sVar22 = auVar88._6_2_;
      uVar83 = CONCAT13((0 < sVar22) * (sVar22 < 0x100) * auVar88[6] - (0xff < sVar22),
                        CONCAT12(cVar15,sVar82));
      sVar22 = auVar88._8_2_;
      cVar16 = (0 < sVar22) * (sVar22 < 0x100) * auVar88[8] - (0xff < sVar22);
      sVar22 = auVar88._10_2_;
      uVar84 = CONCAT15((0 < sVar22) * (sVar22 < 0x100) * auVar88[10] - (0xff < sVar22),
                        CONCAT14(cVar16,uVar83));
      sVar22 = auVar88._12_2_;
      cVar17 = (0 < sVar22) * (sVar22 < 0x100) * auVar88[0xc] - (0xff < sVar22);
      sVar22 = auVar88._14_2_;
      uVar85 = CONCAT17((0 < sVar22) * (sVar22 < 0x100) * auVar88[0xe] - (0xff < sVar22),
                        CONCAT16(cVar17,uVar84));
      sVar22 = auVar90._0_2_;
      cVar18 = (0 < sVar22) * (sVar22 < 0x100) * auVar90[0] - (0xff < sVar22);
      sVar22 = auVar90._2_2_;
      auVar86._0_10_ =
           CONCAT19((0 < sVar22) * (sVar22 < 0x100) * auVar90[2] - (0xff < sVar22),
                    CONCAT18(cVar18,uVar85));
      sVar22 = auVar90._4_2_;
      cVar19 = (0 < sVar22) * (sVar22 < 0x100) * auVar90[4] - (0xff < sVar22);
      auVar86[10] = cVar19;
      sVar22 = auVar90._6_2_;
      auVar86[0xb] = (0 < sVar22) * (sVar22 < 0x100) * auVar90[6] - (0xff < sVar22);
      sVar22 = auVar90._8_2_;
      cVar20 = (0 < sVar22) * (sVar22 < 0x100) * auVar90[8] - (0xff < sVar22);
      auVar87[0xc] = cVar20;
      auVar87._0_12_ = auVar86;
      sVar22 = auVar90._10_2_;
      auVar87[0xd] = (0 < sVar22) * (sVar22 < 0x100) * auVar90[10] - (0xff < sVar22);
      sVar22 = auVar90._12_2_;
      cVar21 = (0 < sVar22) * (sVar22 < 0x100) * auVar90[0xc] - (0xff < sVar22);
      auVar89[0xe] = cVar21;
      auVar89._0_14_ = auVar87;
      sVar22 = auVar90._14_2_;
      auVar89[0xf] = (0 < sVar22) * (sVar22 < 0x100) * auVar90[0xe] - (0xff < sVar22);
      sVar22 = (short)((uint)uVar74 >> 0x10);
      sVar23 = (short)((uint6)uVar75 >> 0x20);
      sVar24 = (short)((ulong)uVar76 >> 0x30);
      sVar25 = (short)((unkuint10)auVar77._0_10_ >> 0x40);
      sVar26 = auVar77._10_2_;
      sVar27 = auVar78._12_2_;
      sVar28 = auVar80._14_2_;
      sVar29 = (short)((uint)uVar83 >> 0x10);
      sVar30 = (short)((uint6)uVar84 >> 0x20);
      sVar31 = (short)((ulong)uVar85 >> 0x30);
      sVar32 = (short)((unkuint10)auVar86._0_10_ >> 0x40);
      sVar33 = auVar86._10_2_;
      sVar34 = auVar87._12_2_;
      sVar35 = auVar89._14_2_;
      pbVar2 = (byte *)((long)pvVar52 + uVar55);
      *pbVar2 = (0 < sVar73) * (sVar73 < 0x100) * cVar6 - (0xff < sVar73) ^ *pbVar1;
      pbVar2[1] = (0 < sVar22) * (sVar22 < 0x100) * cVar7 - (0xff < sVar22) ^ bVar36;
      pbVar2[2] = (0 < sVar23) * (sVar23 < 0x100) * cVar8 - (0xff < sVar23) ^ bVar37;
      pbVar2[3] = (0 < sVar24) * (sVar24 < 0x100) * cVar9 - (0xff < sVar24) ^ bVar38;
      pbVar2[4] = (0 < sVar25) * (sVar25 < 0x100) * cVar10 - (0xff < sVar25) ^ bVar39;
      pbVar2[5] = (0 < sVar26) * (sVar26 < 0x100) * cVar11 - (0xff < sVar26) ^ bVar40;
      pbVar2[6] = (0 < sVar27) * (sVar27 < 0x100) * cVar12 - (0xff < sVar27) ^ bVar41;
      pbVar2[7] = (0 < sVar28) * (sVar28 < 0x100) * cVar13 - (0xff < sVar28) ^ bVar42;
      pbVar2[8] = (0 < sVar82) * (sVar82 < 0x100) * cVar14 - (0xff < sVar82) ^ bVar43;
      pbVar2[9] = (0 < sVar29) * (sVar29 < 0x100) * cVar15 - (0xff < sVar29) ^ bVar44;
      pbVar2[10] = (0 < sVar30) * (sVar30 < 0x100) * cVar16 - (0xff < sVar30) ^ bVar45;
      pbVar2[0xb] = (0 < sVar31) * (sVar31 < 0x100) * cVar17 - (0xff < sVar31) ^ bVar46;
      pbVar2[0xc] = (0 < sVar32) * (sVar32 < 0x100) * cVar18 - (0xff < sVar32) ^ bVar47;
      pbVar2[0xd] = (0 < sVar33) * (sVar33 < 0x100) * cVar19 - (0xff < sVar33) ^ bVar48;
      pbVar2[0xe] = (0 < sVar34) * (sVar34 < 0x100) * cVar20 - (0xff < sVar34) ^ bVar49;
      pbVar2[0xf] = (0 < sVar35) * (sVar35 < 0x100) * cVar21 - (0xff < sVar35) ^ bVar50;
      uVar55 = uVar55 + 0x10;
      uVar69 = uVar69 + 0x10;
      uVar70 = uVar70 + 0x10;
      uVar71 = uVar71 + 0x10;
      uVar72 = uVar72 + 0x10;
      uVar65 = uVar65 + 0x10;
      uVar66 = uVar66 + 0x10;
      uVar67 = uVar67 + 0x10;
      uVar68 = uVar68 + 0x10;
      uVar61 = uVar61 + 0x10;
      uVar62 = uVar62 + 0x10;
      uVar63 = uVar63 + 0x10;
      uVar64 = uVar64 + 0x10;
      uVar57 = uVar57 + 0x10;
      uVar58 = uVar58 + 0x10;
      uVar59 = uVar59 + 0x10;
      uVar60 = uVar60 + 0x10;
    } while (local_3c * 0x30 != uVar55);
  }
  uVar57 = (local_60->super_FResourceFile).NumLumps;
  uVar55 = (ulong)uVar57;
  puVar53 = (ulong *)operator_new__(uVar55 * 0x58 + 8);
  *puVar53 = uVar55;
  if (uVar55 != 0) {
    lVar56 = 0;
    do {
      *(undefined8 *)((long)puVar53 + lVar56 + 0x18) = 0x8a502c;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      *(undefined2 *)((long)puVar53 + lVar56 + 0x30) = 0;
      *(undefined1 *)((long)puVar53 + lVar56 + 0x20) = 0;
      *(undefined1 (*) [16])((long)puVar53 + lVar56 + 0x38) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)puVar53 + lVar56 + 0x44) = (undefined1  [16])0x0;
      *(undefined ***)((long)puVar53 + lVar56 + 8) = &PTR__FResourceLump_0088ba18;
      lVar56 = lVar56 + 0x58;
    } while (uVar55 * 0x58 - lVar56 != 0);
  }
  local_60->Lumps = (FRFFLump *)(puVar53 + 1);
  local_58 = pvVar52;
  if ((!quiet) && (batchrun == false)) {
    Printf(", %d lumps\n",uVar55);
    uVar57 = (local_60->super_FResourceFile).NumLumps;
  }
  if (uVar57 != 0) {
    __src = (char *)((long)local_58 + 0x24);
    lVar56 = 0;
    uVar55 = 0;
    do {
      pFVar5 = local_60->Lumps;
      *(undefined4 *)(&(pFVar5->super_FUncompressedLump).super_FResourceLump.field_0x4c + lVar56) =
           *(undefined4 *)(__src + -0x14);
      *(undefined4 *)
       ((long)&(pFVar5->super_FUncompressedLump).super_FResourceLump.LumpSize + lVar56) =
           *(undefined4 *)(__src + -0x10);
      *(FRFFFile **)((long)&(pFVar5->super_FUncompressedLump).super_FResourceLump.Owner + lVar56) =
           local_60;
      if ((__src[-4] & 0x10U) != 0) {
        pBVar3 = &(pFVar5->super_FUncompressedLump).super_FResourceLump.Flags + lVar56;
        *pBVar3 = *pBVar3 | 8;
      }
      *(undefined4 *)((long)&pFVar5->IndexNum + lVar56) = *(undefined4 *)(__src + 8);
      strncpy(local_6d,__src,8);
      local_65 = 0;
      sVar54 = strlen(local_6d);
      if (0xc < sVar54 + 4) {
        __assert_fail("len + 4 <= 12",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/file_rff.cpp"
                      ,0xab,"virtual bool FRFFFile::Open(bool)");
      }
      local_6d[sVar54] = '.';
      local_6d[sVar54 + 1] = __src[-3];
      local_6d[sVar54 + 2] = __src[-2];
      local_6d[sVar54 + 3] = __src[-1];
      local_6d[sVar54 + 4] = '\0';
      FString::FString(&local_50,local_6d);
      FResourceLump::LumpNameSetup
                ((FResourceLump *)
                 ((long)&(pFVar5->super_FUncompressedLump).super_FResourceLump._vptr_FResourceLump +
                 lVar56),&local_50);
      FString::~FString(&local_50);
      if (local_6d[sVar54 + 1] == 'R') {
        if ((local_6d[sVar54 + 2] == 'A') && (uVar74 = 6, local_6d[sVar54 + 3] == 'W'))
        goto LAB_00631f46;
      }
      else if ((local_6d[sVar54 + 1] == 'S') &&
              ((local_6d[sVar54 + 2] == 'F' && (uVar74 = 7, local_6d[sVar54 + 3] == 'X')))) {
LAB_00631f46:
        *(undefined4 *)
         ((long)&(local_60->Lumps->super_FUncompressedLump).super_FResourceLump.Namespace + lVar56)
             = uVar74;
      }
      uVar55 = uVar55 + 1;
      lVar56 = lVar56 + 0x58;
      __src = __src + 0x30;
    } while (uVar55 < (local_60->super_FResourceFile).NumLumps);
  }
  operator_delete__(local_58);
  return true;
}

Assistant:

bool FRFFFile::Open(bool quiet)
{
	RFFLump *lumps;
	RFFInfo header;

	Reader->Read(&header, sizeof(header));

	NumLumps = LittleLong(header.NumLumps);
	header.DirOfs = LittleLong(header.DirOfs);
	lumps = new RFFLump[header.NumLumps];
	Reader->Seek (header.DirOfs, SEEK_SET);
	Reader->Read (lumps, header.NumLumps * sizeof(RFFLump));
	BloodCrypt (lumps, header.DirOfs, header.NumLumps * sizeof(RFFLump));

	Lumps = new FRFFLump[NumLumps];

	if (!quiet && !batchrun) Printf(", %d lumps\n", NumLumps);
	for (DWORD i = 0; i < NumLumps; ++i)
	{
		Lumps[i].Position = LittleLong(lumps[i].FilePos);
		Lumps[i].LumpSize = LittleLong(lumps[i].Size);
		Lumps[i].Owner = this;
		if (lumps[i].Flags & 0x10)
		{
			Lumps[i].Flags |= LUMPF_BLOODCRYPT;
		}
		Lumps[i].IndexNum = LittleLong(lumps[i].IndexNum);
		// Rearrange the name and extension to construct the fullname.
		char name[13];
		strncpy(name, lumps[i].Name, 8);
		name[8] = 0;
		size_t len = strlen(name);
		assert(len + 4 <= 12);
		name[len+0] = '.';
		name[len+1] = lumps[i].Extension[0];
		name[len+2] = lumps[i].Extension[1];
		name[len+3] = lumps[i].Extension[2];
		name[len+4] = 0;
		Lumps[i].LumpNameSetup(name);
		if (name[len+1] == 'S' && name[len+2] == 'F' && name[len+3] == 'X')
		{
			Lumps[i].Namespace = ns_bloodsfx;
		}
		else if (name[len+1] == 'R' && name[len+2] == 'A' && name[len+3] == 'W')
		{
			Lumps[i].Namespace = ns_bloodraw;
		}
	}
	delete[] lumps;
	return true;
}